

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.h
# Opt level: O0

void __thiscall irr::io::IFileReadCallBack::IFileReadCallBack(IFileReadCallBack *this)

{
  IFileReadCallBack *this_local;
  
  this->_vptr_IFileReadCallBack = (_func_int **)&PTR__IFileReadCallBack_00f3f8d0;
  return;
}

Assistant:

class IRRXML_API IFileReadCallBack
	{
	public:

		//! virtual destructor
		virtual ~IFileReadCallBack() {};

		//! Reads an amount of bytes from the file.
		/** \param buffer: Pointer to buffer where to read bytes will be written to.
		\param sizeToRead: Amount of bytes to read from the file.
		\return Returns how much bytes were read. */
		virtual int read(void* buffer, int sizeToRead) = 0;

		//! Returns size of file in bytes
		virtual int getSize() = 0;
	}